

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

Instrument * __thiscall
SFFile::LoadInstrumentOrder(SFFile *this,Renderer *song,int order,int drum,int bank,int program)

{
  byte bVar1;
  uint uVar2;
  Instrument *in_RAX;
  SFPerc *perc;
  SFPreset *preset;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  if (drum == 0) {
    lVar4 = (long)this->NumPresets;
    bVar6 = 1 < lVar4;
    if (1 < lVar4) {
      preset = this->Presets;
      uVar3 = 1;
      do {
        if ((((order < 0) ||
             (uVar2 = (byte)preset->field_0x15 & 0x7f, in_RAX = (Instrument *)(ulong)uVar2,
             uVar2 == order)) &&
            (in_RAX = (Instrument *)(ulong)preset->Bank, (uint)preset->Bank == bank)) &&
           (in_RAX = (Instrument *)(ulong)preset->Program, (uint)preset->Program == program)) {
          in_RAX = LoadPreset(this,song,preset);
          break;
        }
        bVar6 = (long)uVar3 < (long)(lVar4 - 1U);
        preset = preset + 1;
        bVar7 = uVar3 != (lVar4 - 1U & 0xffffffff);
        uVar3 = uVar3 + 1;
      } while (bVar7);
    }
  }
  else {
    uVar3 = (ulong)(this->Percussion).Count;
    bVar6 = uVar3 != 0;
    if (bVar6) {
      perc = (this->Percussion).Array;
      uVar5 = 1;
      do {
        if (((order < 0) ||
            (in_RAX = (Instrument *)(ulong)perc->LoadOrder, (uint)perc->LoadOrder == order)) &&
           ((bVar1 = (perc->Generators).field_0.keyRange.Lo, in_RAX = (Instrument *)(ulong)bVar1,
            (uint)bVar1 == bank &&
            (bVar1 = (perc->Generators).field_0.keyRange.Hi, in_RAX = (Instrument *)(ulong)bVar1,
            (uint)bVar1 == program)))) {
          in_RAX = LoadPercussion(this,song,perc);
          break;
        }
        bVar6 = uVar5 < uVar3;
        perc = perc + 1;
        bVar7 = uVar5 != uVar3;
        uVar5 = uVar5 + 1;
      } while (bVar7);
    }
  }
  if (!bVar6) {
    in_RAX = (Instrument *)0x0;
  }
  return in_RAX;
}

Assistant:

Instrument *SFFile::LoadInstrumentOrder(Renderer *song, int order, int drum, int bank, int program)
{
	if (drum)
	{
		for (unsigned int i = 0; i < Percussion.Size(); ++i)
		{
			if ((order < 0 || Percussion[i].LoadOrder == order) &&
				Percussion[i].Generators.drumset == bank &&
				Percussion[i].Generators.key == program)
			{
				return LoadPercussion(song, &Percussion[i]);
			}
		}
	}
	else
	{
		for (int i = 0; i < NumPresets - 1; ++i)
		{
			if ((order < 0 || Presets[i].LoadOrder == order) &&
				Presets[i].Bank == bank &&
				Presets[i].Program == program)
			{
				return LoadPreset(song, &Presets[i]);
			}
		}
	}
	return NULL;
}